

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec2 __thiscall tcu::projectToFace(tcu *this,CubeFace face,Vec3 *coord)

{
  Vec2 VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (CUBEFACE_POSITIVE_Z < face) {
    fVar3 = 0.0;
    fVar5 = 0.0;
    fVar4 = 0.0;
    fVar2 = 0.0;
    goto LAB_00a5e806;
  }
  fVar3 = coord->m_data[0];
  fVar5 = 0.0;
  fVar4 = coord->m_data[1];
  fVar2 = coord->m_data[2];
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    fVar6 = -fVar3;
    fVar5 = 0.0;
    break;
  case CUBEFACE_POSITIVE_X:
    fVar2 = -fVar2;
    fVar5 = -0.0;
    fVar6 = fVar3;
    break;
  case CUBEFACE_NEGATIVE_Y:
    fVar2 = -fVar2;
    fVar4 = -fVar4;
  case CUBEFACE_POSITIVE_Y:
    goto LAB_00a5e806;
  case CUBEFACE_NEGATIVE_Z:
    fVar5 = -0.0;
    fVar3 = -fVar3;
    fVar2 = -fVar2;
    goto LAB_00a5e800;
  case CUBEFACE_POSITIVE_Z:
LAB_00a5e800:
    fVar6 = -fVar4;
    fVar4 = fVar2;
    fVar2 = fVar6;
    goto LAB_00a5e806;
  }
  fVar3 = fVar2;
  fVar2 = -fVar4;
  fVar4 = fVar6;
LAB_00a5e806:
  fVar3 = (fVar3 / fVar4 + 1.0) * 0.5;
  *(float *)this = fVar3;
  *(float *)(this + 4) = (fVar2 / fVar4 + 1.0) * 0.5;
  VVar1.m_data[1] = fVar5;
  VVar1.m_data[0] = fVar3;
  return (Vec2)VVar1.m_data;
}

Assistant:

Vec2 projectToFace (CubeFace face, const Vec3& coord)
{
	const float	rx		= coord.x();
	const float	ry		= coord.y();
	const float	rz		= coord.z();
	float		sc		= 0.0f;
	float		tc		= 0.0f;
	float		ma		= 0.0f;
	float		s;
	float		t;

	switch (face)
	{
		case CUBEFACE_NEGATIVE_X: sc = +rz; tc = -ry; ma = -rx; break;
		case CUBEFACE_POSITIVE_X: sc = -rz; tc = -ry; ma = +rx; break;
		case CUBEFACE_NEGATIVE_Y: sc = +rx; tc = -rz; ma = -ry; break;
		case CUBEFACE_POSITIVE_Y: sc = +rx; tc = +rz; ma = +ry; break;
		case CUBEFACE_NEGATIVE_Z: sc = -rx; tc = -ry; ma = -rz; break;
		case CUBEFACE_POSITIVE_Z: sc = +rx; tc = -ry; ma = +rz; break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	// Compute s, t
	s = ((sc / ma) + 1.0f) / 2.0f;
	t = ((tc / ma) + 1.0f) / 2.0f;

	return Vec2(s, t);
}